

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O2

EdgePolyline * __thiscall
S2Builder::Graph::PolylineBuilder::BuildWalk
          (EdgePolyline *__return_storage_ptr__,PolylineBuilder *this,VertexId v)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  PolylineBuilder *pPVar4;
  int iVar5;
  mapped_type *pmVar6;
  long lVar7;
  EdgeId e;
  size_type sVar8;
  int iVar9;
  reference rVar10;
  EdgeId best_edge;
  value_type_conflict2 local_50;
  int local_4c;
  PolylineBuilder *local_48;
  EdgePolyline *local_40;
  btree_map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256> *local_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &this->used_;
  local_38 = &this->excess_used_;
  local_4c = v;
  local_48 = this;
  local_40 = __return_storage_ptr__;
  do {
    local_50 = -1;
    piVar2 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = piVar2[(long)local_4c + 1];
    iVar9 = 0x7fffffff;
    for (sVar8 = (size_type)piVar2[local_4c]; pPVar4 = local_48, (long)iVar5 != sVar8;
        sVar8 = sVar8 + 1) {
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar8);
      if (((*rVar10._M_p & rVar10._M_mask) == 0) &&
         (iVar1 = (this->min_input_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar8], iVar1 < iVar9)) {
        local_50 = (value_type_conflict2)sVar8;
        iVar9 = iVar1;
      }
    }
    if (local_50 < 0) {
      return local_40;
    }
    iVar5 = excess_degree(local_48,local_4c);
    pmVar6 = gtl::internal_btree::
             btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
             ::operator[](&local_38->
                           super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                          ,&local_4c);
    if (pPVar4->directed_ == true) {
      if (iVar5 - *pmVar6 < 0) {
LAB_00208711:
        piVar2 = (local_48->in_).in_edge_ids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = (local_48->in_).in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar5 = piVar3[(long)local_4c + 1];
        for (lVar7 = (long)piVar3[local_4c] << 2; (long)iVar5 * 4 != lVar7; lVar7 = lVar7 + 4) {
          sVar8 = (size_type)*(int *)((long)piVar2 + lVar7);
          rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar8);
          if (((*rVar10._M_p & rVar10._M_mask) == 0) &&
             ((local_48->min_input_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[sVar8] <= iVar9)) {
            return local_40;
          }
        }
      }
    }
    else if ((iVar5 - *pmVar6 & 0x80000001U) == 1) goto LAB_00208711;
    std::vector<int,_std::allocator<int>_>::push_back(local_40,&local_50);
    this = local_48;
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(long)local_50);
    *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
    if (this->directed_ == false) {
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (this_00,(long)(this->sibling_map_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start[local_50]);
      *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
    }
    this->edges_left_ = this->edges_left_ + -1;
    local_4c = (this->g_->edges_->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start[local_50].second;
  } while( true );
}

Assistant:

Graph::EdgePolyline Graph::PolylineBuilder::BuildWalk(VertexId v) {
  EdgePolyline polyline;
  for (;;) {
    // Follow the edge with the smallest input edge id.
    EdgeId best_edge = -1;
    InputEdgeId best_out_id = std::numeric_limits<InputEdgeId>::max();
    for (EdgeId e : out_.edge_ids(v)) {
      if (used_[e] || min_input_ids_[e] >= best_out_id) continue;
      best_out_id = min_input_ids_[e];
      best_edge = e;
    }
    if (best_edge < 0) return polyline;
    // For idempotency when there are multiple input polylines, we stop the
    // walk early if "best_edge" might be a continuation of a different
    // incoming edge.
    int excess = excess_degree(v) - excess_used_[v];
    if (directed_ ? (excess < 0) : (excess % 2) == 1) {
      for (EdgeId e : in_.edge_ids(v)) {
        if (!used_[e] && min_input_ids_[e] <= best_out_id) {
          return polyline;
        }
      }
    }
    polyline.push_back(best_edge);
    used_[best_edge] = true;
    if (!directed_) used_[sibling_map_[best_edge]] = true;
    --edges_left_;
    v = g_.edge(best_edge).second;
  }
}